

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-mem-type.c
# Opt level: O2

int coda_mem_array_add_element(coda_mem_array *type,coda_dynamic_type *element)

{
  long lVar1;
  long lVar2;
  coda_dynamic_type **__ptr;
  undefined8 uVar3;
  ulong uVar4;
  long lVar5;
  char *message;
  
  if (type == (coda_mem_array *)0x0) {
    message = "type argument is NULL (%s:%u)";
    uVar3 = 0x2a2;
  }
  else {
    if (element != (coda_dynamic_type *)0x0) {
      if (type->definition->base_type != element->definition) {
        coda_set_error(-400,"trying to add array element \'%ld\' of incompatible type (%s:%u)",
                       type->num_elements,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                       ,0x2ad);
        return -1;
      }
      if (type->definition->num_elements < 1) {
        uVar4 = type->num_elements;
        __ptr = type->element;
        if ((uVar4 & 0xf) == 0) {
          __ptr = (coda_dynamic_type **)realloc(__ptr,uVar4 * 8 + 0x80);
          if (__ptr == (coda_dynamic_type **)0x0) {
            coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",
                           type->num_elements * 8 + 0x80,
                           "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                           ,0x2cb);
            return -1;
          }
          type->element = __ptr;
          uVar4 = type->num_elements;
        }
        type->num_elements = uVar4 + 1;
        __ptr[uVar4] = element;
        return 0;
      }
      lVar1 = type->num_elements;
      lVar2 = 0;
      lVar5 = 0;
      if (0 < lVar1) {
        lVar5 = lVar1;
      }
      do {
        if (lVar5 == lVar2) {
LAB_0015ccd3:
          coda_set_error(-0x65,"array index (%ld) is not in the range [0,%ld) (%s:%u)",lVar5,lVar1,
                         "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                         ,700);
          return -1;
        }
        if (type->element[lVar2] == (coda_dynamic_type *)0x0) {
          lVar5 = lVar2;
          if (lVar2 < lVar1) {
            type->element[lVar2] = element;
            return 0;
          }
          goto LAB_0015ccd3;
        }
        lVar2 = lVar2 + 1;
      } while( true );
    }
    message = "element argument is NULL (%s:%u)";
    uVar3 = 0x2a7;
  }
  coda_set_error(-100,message,
                 "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-mem-type.c"
                 ,uVar3);
  return -1;
}

Assistant:

int coda_mem_array_add_element(coda_mem_array *type, coda_dynamic_type *element)
{
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (element == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "element argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (type->definition->base_type != element->definition)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "trying to add array element '%ld' of incompatible type (%s:%u)",
                       type->num_elements, __FILE__, __LINE__);
        return -1;
    }
    if (type->definition->num_elements > 0)
    {
        long index = 0;

        /* use the first free array element */
        while (index < type->num_elements && type->element[index] != NULL)
        {
            index++;
        }
        if (index >= type->num_elements)
        {
            coda_set_error(CODA_ERROR_INVALID_INDEX, "array index (%ld) is not in the range [0,%ld) (%s:%u)", index,
                           type->num_elements, __FILE__, __LINE__);
            return -1;
        }
        type->element[index] = element;
    }
    else
    {
        if (type->num_elements % BLOCK_SIZE == 0)
        {
            coda_dynamic_type **new_element;

            new_element = realloc(type->element, (type->num_elements + BLOCK_SIZE) * sizeof(coda_dynamic_type *));
            if (new_element == NULL)
            {
                coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                               (type->num_elements + BLOCK_SIZE) * sizeof(coda_dynamic_type *), __FILE__, __LINE__);
                return -1;
            }
            type->element = new_element;
        }
        type->num_elements++;
        type->element[type->num_elements - 1] = element;
    }

    return 0;
}